

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O0

bool __thiscall
JsUtil::BackgroundJobProcessor::WaitWithThread
          (BackgroundJobProcessor *this,ParallelThreadData *parallelThreadData,Event *e,
          uint milliseconds)

{
  bool bVar1;
  DWORD DVar2;
  DWORD local_3c;
  uint result;
  DWORD handleCount;
  HANDLE handles [2];
  uint milliseconds_local;
  Event *e_local;
  ParallelThreadData *parallelThreadData_local;
  BackgroundJobProcessor *this_local;
  
  handles[1]._4_4_ = milliseconds;
  _result = Event::Handle(e);
  handles[0] = parallelThreadData->threadHandle;
  local_3c = 2;
  bVar1 = ThreadService::HasCallback(this->threadService);
  if (bVar1) {
    local_3c = 1;
  }
  DVar2 = WaitForMultipleObjectsEx(local_3c,(HANDLE *)&result,0,handles[1]._4_4_,0);
  if (((DVar2 != 0) && (DVar2 != 1)) && ((DVar2 != 0x102 || (handles[1]._4_4_ == 0xffffffff)))) {
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  if (DVar2 == 1) {
    parallelThreadData->isWaitingForJobs = false;
  }
  return DVar2 == 0;
}

Assistant:

bool BackgroundJobProcessor::WaitWithThread(ParallelThreadData *parallelThreadData, const Event &e, const unsigned int milliseconds)
    {
        const HANDLE handles[] = { e.Handle(), parallelThreadData->threadHandle };

        // If we have a thread service, then only wait on the event, not the actual thread handle.
        DWORD handleCount = 2;
        if (threadService->HasCallback())
        {
            handleCount = 1;
        }

        const unsigned int result = WaitForMultipleObjectsEx(handleCount, handles, false, milliseconds, false);

        if (!(result == WAIT_OBJECT_0 || result == WAIT_OBJECT_0 + 1 || (result == WAIT_TIMEOUT && milliseconds != INFINITE)))
        {
            Js::Throw::FatalInternalError();
        }

        if (result == WAIT_OBJECT_0 + 1)
        {
            // Apparently, sometimes the thread dies while waiting for an event. It should only be during process shutdown but
            // we can't know because DLL_PROCESS_DETACH may not have been called yet, which is bizarre. It seems unclear why
            // this happens and this could cause unpredictable behavior since the behavior of this object is undefined if the
            // thread is killed arbitrarily, or if there are incoming calls after Close. In any case, uses of this function have
            // been ported from BackgroundCodeGenThread. For now, we assume that Close will be called eventually and set the
            // state to what it should be before Close is called.
            parallelThreadData->isWaitingForJobs = false;
        }

        return result == WAIT_OBJECT_0;

    }